

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationRuleParser::parseRelationOperator(CollationRuleParser *this,UErrorCode *errorCode)

{
  short sVar1;
  char16_t cVar2;
  UnicodeString *pUVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char16_t *pcVar7;
  uint uVar8;
  long lVar9;
  
  uVar6 = 0xffffffff;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar4 = skipWhiteSpace(this,this->ruleIndex);
    this->ruleIndex = uVar4;
    pUVar3 = this->rules;
    sVar1 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar8 = (pUVar3->fUnion).fFields.fLength;
    }
    else {
      uVar8 = (int)sVar1 >> 5;
    }
    if (((int)uVar4 < (int)uVar8) && (uVar4 < uVar8)) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar7 = (pUVar3->fUnion).fFields.fArray;
      }
      else {
        pcVar7 = (char16_t *)((long)&pUVar3->fUnion + 2);
      }
      uVar5 = uVar4 + 1;
      cVar2 = pcVar7[(int)uVar4];
      if ((ushort)cVar2 < 0x3c) {
        if (cVar2 == L',') {
          uVar6 = 2;
        }
        else {
          uVar6 = 1;
          if (cVar2 != L';') {
            return -1;
          }
        }
      }
      else if (cVar2 == L'=') {
        uVar6 = 0xf;
        if (uVar5 < uVar8 && (int)uVar5 < (int)uVar8) {
          lVar9 = (long)(int)uVar5;
          if (pcVar7[lVar9] == L'*') {
            uVar5 = uVar4 + 2;
          }
          uVar6 = (uint)(pcVar7[lVar9] == L'*') << 4 | 0xf;
        }
      }
      else {
        if (cVar2 != L'<') {
          return -1;
        }
        uVar6 = 0;
        if ((uVar5 < uVar8 && (int)uVar5 < (int)uVar8) && (uVar6 = 0, pcVar7[(int)uVar5] == L'<')) {
          uVar5 = uVar4 + 2;
          uVar6 = 1;
          if ((uVar5 < uVar8 && (int)uVar5 < (int)uVar8) && (pcVar7[(int)uVar5] == L'<')) {
            uVar5 = uVar4 + 3;
            uVar6 = 2;
            if (uVar5 < uVar8 && (int)uVar5 < (int)uVar8) {
              lVar9 = (long)(int)uVar5;
              if (pcVar7[lVar9] == L'<') {
                uVar5 = uVar4 + 4;
              }
              uVar6 = pcVar7[lVar9] == L'<' | 2;
            }
          }
        }
        if ((uVar5 < uVar8 && (int)uVar5 < (int)uVar8) && (pcVar7[(int)uVar5] == L'*')) {
          uVar5 = uVar5 + 1;
          uVar6 = uVar6 | 0x10;
        }
      }
      uVar6 = (uVar5 - uVar4) * 0x100 | uVar6;
    }
  }
  return uVar6;
}

Assistant:

int32_t
CollationRuleParser::parseRelationOperator(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return UCOL_DEFAULT; }
    ruleIndex = skipWhiteSpace(ruleIndex);
    if(ruleIndex >= rules->length()) { return UCOL_DEFAULT; }
    int32_t strength;
    int32_t i = ruleIndex;
    UChar c = rules->charAt(i++);
    switch(c) {
    case 0x3c:  // '<'
        if(i < rules->length() && rules->charAt(i) == 0x3c) {  // <<
            ++i;
            if(i < rules->length() && rules->charAt(i) == 0x3c) {  // <<<
                ++i;
                if(i < rules->length() && rules->charAt(i) == 0x3c) {  // <<<<
                    ++i;
                    strength = UCOL_QUATERNARY;
                } else {
                    strength = UCOL_TERTIARY;
                }
            } else {
                strength = UCOL_SECONDARY;
            }
        } else {
            strength = UCOL_PRIMARY;
        }
        if(i < rules->length() && rules->charAt(i) == 0x2a) {  // '*'
            ++i;
            strength |= STARRED_FLAG;
        }
        break;
    case 0x3b:  // ';' same as <<
        strength = UCOL_SECONDARY;
        break;
    case 0x2c:  // ',' same as <<<
        strength = UCOL_TERTIARY;
        break;
    case 0x3d:  // '='
        strength = UCOL_IDENTICAL;
        if(i < rules->length() && rules->charAt(i) == 0x2a) {  // '*'
            ++i;
            strength |= STARRED_FLAG;
        }
        break;
    default:
        return UCOL_DEFAULT;
    }
    return ((i - ruleIndex) << OFFSET_SHIFT) | strength;
}